

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O3

void __thiscall cmSearchPath::AddPathInternal(cmSearchPath *this,string *path,char *base)

{
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  string collapsed;
  string local_30;
  
  if (this->FC != (cmFindCommon *)0x0) {
    cmsys::SystemTools::CollapseFullPath(&local_30,path,base);
    if (local_30._M_string_length != 0) {
      pVar1 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->FC->SearchPathsEmitted,&local_30);
      if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->Paths,&local_30);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("this->FC != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmSearchPath.cxx"
                ,0x104,"void cmSearchPath::AddPathInternal(const std::string &, const char *)");
}

Assistant:

void cmSearchPath::AddPathInternal(const std::string& path, const char *base)
{
  assert(this->FC != NULL);

  std::string collapsed = cmSystemTools::CollapseFullPath(path, base);

   if(collapsed.empty())
    {
    return;
    }

  // Insert the path if has not already been emitted.
  if(this->FC->SearchPathsEmitted.insert(collapsed).second)
    {
    this->Paths.push_back(collapsed);
    }
}